

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  int *piVar8;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar9;
  __sighandler_t p_Var10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar14;
  ulong uVar15;
  undefined8 uVar16;
  const_iterator __position;
  size_t __len;
  int pipe_fd [2];
  Arguments args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  string filter_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  sigaction ignore_sigprof_action;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  long local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  long local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  int local_210;
  int local_20c;
  string local_208;
  int local_1e4;
  string local_1e0;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  string local_1a0;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  _union_1457 local_160;
  long local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [8];
  _union_1457 local_c8;
  undefined1 local_c0 [8];
  ulong local_b8;
  ulong uStack_b0;
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  local_1e4 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  iVar3 = pipe(&local_210);
  if (iVar3 == -1) {
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_310 == puVar9) {
      local_300 = *puVar9;
      lStack_2f8 = puVar7[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar9;
    }
    local_308 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if (local_2d0 == paVar12) {
      local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_2c0._8_8_ = plVar6[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_2c8 = plVar6[1];
    *plVar6 = (long)paVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x46b;
    StreamableToString<int>(&local_290,(int *)&local_250);
    uVar16 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar16 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_290._M_string_length + local_2c8) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar16 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_290._M_string_length + local_2c8) goto LAB_00205597;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_00205597:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar12) {
      local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar7[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar7[1];
    *puVar7 = paVar12;
    puVar7[1] = 0;
    paVar12->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_c8.sa_handler = (__sighandler_t)*puVar7;
    p_Var10 = (__sighandler_t)(puVar7 + 2);
    if (local_c8.sa_handler == p_Var10) {
      local_b8 = *(ulong *)p_Var10;
      uStack_b0 = puVar7[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(ulong *)p_Var10;
    }
    local_c0 = (undefined1  [8])puVar7[1];
    *puVar7 = p_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    local_160.sa_handler = (__sighandler_t)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.sa_handler == paVar12) {
      local_150[0]._0_8_ = paVar12->_M_allocated_capacity;
      local_150[0]._8_8_ = puVar7[3];
      local_160.sa_handler = (__sighandler_t)local_150;
    }
    else {
      local_150[0]._0_8_ = paVar12->_M_allocated_capacity;
    }
    local_158 = puVar7[1];
    *puVar7 = paVar12;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    DeathTestAbort((string *)&local_160);
    puVar7 = extraout_RAX_02;
    local_160 = extraout_RDX_02;
LAB_00205fe4:
    local_150[0]._0_8_ = paVar12->_M_allocated_capacity;
  }
  else {
    iVar3 = fcntl(local_20c,2,0);
    if (iVar3 != -1) {
      local_2f0 = &local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_300 = *puVar9;
        lStack_2f8 = plVar6[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar9;
        local_310 = (ulong *)*plVar6;
      }
      local_308 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_310);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar12) {
        local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2c0._8_8_ = plVar6[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_2c8 = plVar6[1];
      *plVar6 = (long)paVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar12) {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2b0._M_string_length = plVar6[1];
      *plVar6 = (long)paVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_c8.sa_handler = (__sighandler_t)&local_b8;
      p_Var10 = (__sighandler_t)(plVar6 + 2);
      if ((__sighandler_t)*plVar6 == p_Var10) {
        local_b8 = *(ulong *)p_Var10;
        uStack_b0 = plVar6[3];
      }
      else {
        local_b8 = *(ulong *)p_Var10;
        local_c8.sa_handler = (__sighandler_t)*plVar6;
      }
      local_c0 = (undefined1  [8])plVar6[1];
      *plVar6 = (long)p_Var10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar12) {
        local_150[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_150[0]._8_8_ = puVar7[3];
        local_160.sa_handler = (__sighandler_t)local_150;
      }
      else {
        local_150[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_160.sa_handler = (__sighandler_t)*puVar7;
      }
      local_158 = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
      local_180 = &local_170;
      plVar11 = plVar6 + 2;
      if ((long *)*plVar6 == plVar11) {
        local_170 = *plVar11;
        lStack_168 = plVar6[3];
      }
      else {
        local_170 = *plVar11;
        local_180 = (long *)*plVar6;
      }
      local_178 = plVar6[1];
      *plVar6 = (long)plVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.sa_handler != local_150) {
        operator_delete(local_160.sa_handler,local_150[0]._M_allocated_capacity + 1);
      }
      if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
        operator_delete(local_c8.sa_handler,local_b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310,local_300 + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_270.field_2._M_allocated_capacity = *puVar9;
        local_270.field_2._8_8_ = plVar6[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar9;
        local_270._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_270._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_250.field_2._M_allocated_capacity = *puVar9;
        local_250.field_2._8_8_ = plVar6[3];
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar9;
        local_250._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_250._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_290.field_2._M_allocated_capacity = *puVar9;
        local_290.field_2._8_8_ = plVar6[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar9;
        local_290._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_290._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar12) {
        local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2e0._8_8_ = puVar7[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
      }
      local_2e8 = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_300 = *puVar9;
        lStack_2f8 = plVar6[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar9;
        local_310 = (ulong *)*plVar6;
      }
      local_308 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      StreamableToString<int>(&local_208,&this->line_);
      uVar15 = 0xf;
      if (local_310 != &local_300) {
        uVar15 = local_300;
      }
      if (uVar15 < local_208._M_string_length + local_308) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          uVar16 = local_208.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_208._M_string_length + local_308) goto LAB_002040d0;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_310);
      }
      else {
LAB_002040d0:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_310,(ulong)local_208._M_dataplus._M_p);
      }
      local_2d0 = &local_2c0;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar12) {
        local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2c0._8_8_ = puVar7[3];
      }
      else {
        local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
      }
      local_2c8 = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      paVar12->_M_local_buf[0] = '\0';
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar12) {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar7[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_2b0._M_string_length = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      StreamableToString<int>(&local_1e0,&local_1e4);
      uVar15 = CONCAT44(local_1e0._M_string_length._4_4_,(int)local_1e0._M_string_length) +
               local_2b0._M_string_length;
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar16 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < uVar15) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          uVar16 = local_1e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < uVar15) goto LAB_002041f8;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
      }
      else {
LAB_002041f8:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b0,(ulong)local_1e0._M_dataplus._M_p);
      }
      local_c8.sa_handler = (__sighandler_t)&local_b8;
      p_Var10 = (__sighandler_t)(puVar7 + 2);
      if ((__sighandler_t)*puVar7 == p_Var10) {
        local_b8 = *(ulong *)p_Var10;
        uStack_b0 = puVar7[3];
      }
      else {
        local_b8 = *(ulong *)p_Var10;
        local_c8.sa_handler = (__sighandler_t)*puVar7;
      }
      local_c0 = (undefined1  [8])puVar7[1];
      *puVar7 = p_Var10;
      puVar7[1] = 0;
      *p_Var10 = (__sighandler_t)0x0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar12) {
        local_150[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_150[0]._8_8_ = puVar7[3];
        local_160.sa_handler = (__sighandler_t)local_150;
      }
      else {
        local_150[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_160.sa_handler = (__sighandler_t)*puVar7;
      }
      local_158 = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      StreamableToString<int>(&local_1a0,&local_20c);
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.sa_handler != local_150) {
        uVar16 = local_150[0]._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_158 + local_1a0._M_string_length) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
            &local_1a0.field_2) {
          uVar16 = local_1a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_158 + local_1a0._M_string_length) goto LAB_0020433f;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_160);
      }
      else {
LAB_0020433f:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_160,
                            CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                     local_1a0._M_dataplus._M_p._0_4_));
      }
      local_1c0 = &local_1b0;
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_1b0 = *plVar6;
        uStack_1a8 = puVar7[3];
      }
      else {
        local_1b0 = *plVar6;
        local_1c0 = (long *)*puVar7;
      }
      local_1b8 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)plVar6 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
          &local_1a0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_),
                        local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.sa_handler != local_150) {
        operator_delete(local_160.sa_handler,local_150[0]._M_allocated_capacity + 1);
      }
      if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
        operator_delete(local_c8.sa_handler,local_b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310,local_300 + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)&local_208);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_160,__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)&local_208,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_160);
      __position._M_current = (char **)(local_208._M_string_length - 8);
      local_160.sa_handler = (__sighandler_t)strdup((char *)local_180);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,__position,
                 (value_type *)&local_160.sa_handler);
      local_160.sa_handler = (__sighandler_t)strdup((char *)local_1c0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,
                 (char **)(local_208._M_string_length - 8),(value_type *)&local_160.sa_handler);
      local_160.sa_handler = (__sighandler_t)local_150;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.sa_handler != local_150) {
        operator_delete(local_160.sa_handler,local_150[0]._M_allocated_capacity + 1);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_1e0._M_dataplus._M_p = local_208._M_dataplus._M_p;
      local_1e0._M_string_length._0_4_ = local_210;
      memset(&local_c8,0,0x98);
      sigemptyset((sigset_t *)local_c0);
      local_c8 = (_union_1457)0x1;
      do {
        iVar3 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)&local_160);
        cVar2 = FLAGS_gtest_death_test_use_fork;
        if (iVar3 != -1) {
          iVar3 = -1;
          if (FLAGS_gtest_death_test_use_fork == '\0') {
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
              AssumeRole();
            }
            uVar4 = getpagesize();
            __len = (size_t)(int)uVar4;
            __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
            if (__addr == (void *)0xffffffffffffffff) {
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_250,"CHECK failed: File ","");
              puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
              local_290._M_dataplus._M_p = (pointer)*puVar7;
              puVar9 = puVar7 + 2;
              if ((ulong *)local_290._M_dataplus._M_p == puVar9) {
                local_290.field_2._M_allocated_capacity = *puVar9;
                local_290.field_2._8_8_ = puVar7[3];
                local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
              }
              else {
                local_290.field_2._M_allocated_capacity = *puVar9;
              }
              local_290._M_string_length = puVar7[1];
              *puVar7 = puVar9;
              puVar7[1] = 0;
              *(undefined1 *)(puVar7 + 2) = 0;
              puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
              local_2f0 = &local_2e0;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar7;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar7 + 2);
              if (paVar12 != paVar13) goto LAB_002058d5;
              local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_2e0._8_8_ = puVar7[3];
              goto LAB_002058e2;
            }
            lVar14 = 0;
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
              lVar14 = __len - 0x40;
            }
            if ((0x40 < uVar4) && (((ulong)(lVar14 + (long)__addr) & 0x3f) == 0)) {
              iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar14 + (long)__addr),0x11,&local_1e0);
              iVar5 = munmap(__addr,__len);
              if (iVar5 != -1) goto LAB_00204800;
              goto LAB_00204f4c;
            }
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,"CHECK failed: File ","");
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
            local_290._M_dataplus._M_p = (pointer)*puVar7;
            puVar9 = puVar7 + 2;
            if ((ulong *)local_290._M_dataplus._M_p == puVar9) {
              local_290.field_2._M_allocated_capacity = *puVar9;
              local_290.field_2._8_8_ = puVar7[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = *puVar9;
            }
            local_290._M_string_length = puVar7[1];
            *puVar7 = puVar9;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
            local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar7;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if (local_2f0 == paVar12) {
              local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_2e0._8_8_ = puVar7[3];
              local_2f0 = &local_2e0;
            }
            else {
              local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            }
            local_2e8 = puVar7[1];
            *puVar7 = paVar12;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            local_230._M_dataplus._M_p._0_4_ = 0x442;
            StreamableToString<int>(&local_270,(int *)&local_230);
            uVar16 = 0xf;
            if (local_2f0 != &local_2e0) {
              uVar16 = local_2e0._M_allocated_capacity;
            }
            if ((ulong)uVar16 < local_270._M_string_length + local_2e8) {
              uVar16 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p != &local_270.field_2) {
                uVar16 = local_270.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar16 < local_270._M_string_length + local_2e8) goto LAB_00205a1a;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
            }
            else {
LAB_00205a1a:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
            }
            local_310 = (ulong *)*puVar7;
            puVar9 = puVar7 + 2;
            if (local_310 == puVar9) {
              local_300 = *puVar9;
              lStack_2f8 = puVar7[3];
              local_310 = &local_300;
            }
            else {
              local_300 = *puVar9;
            }
            local_308 = puVar7[1];
            *puVar7 = puVar9;
            puVar7[1] = 0;
            *(undefined1 *)puVar9 = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
            local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar7;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if (local_2d0 == paVar12) {
              local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_2c0._8_8_ = puVar7[3];
              local_2d0 = &local_2c0;
            }
            else {
              local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            }
            local_2c8 = puVar7[1];
            *puVar7 = paVar12;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if (paVar12 != paVar13) goto LAB_0020619d;
            local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_2b0.field_2._8_8_ = puVar7[3];
            goto LAB_002061aa;
          }
LAB_00204800:
          if ((cVar2 == '\0') || (iVar3 = fork(), iVar3 != 0)) {
            goto LAB_0020481c;
          }
          ExecDeathTestChildMain(&local_1e0);
LAB_00204f4c:
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CHECK failed: File ","");
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_290._M_dataplus._M_p = (pointer)*puVar7;
          puVar9 = puVar7 + 2;
          if ((ulong *)local_290._M_dataplus._M_p == puVar9) {
            local_290.field_2._M_allocated_capacity = *puVar9;
            local_290.field_2._8_8_ = puVar7[3];
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          }
          else {
            local_290.field_2._M_allocated_capacity = *puVar9;
          }
          local_290._M_string_length = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
          local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if (local_2f0 == paVar12) {
            local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_2e0._8_8_ = puVar7[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          }
          local_2e8 = puVar7[1];
          *puVar7 = paVar12;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x446;
          StreamableToString<int>(&local_270,(int *)&local_230);
          uVar16 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar16 = local_2e0._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_270._M_string_length + local_2e8) {
            uVar16 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              uVar16 = local_270.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar16 < local_270._M_string_length + local_2e8) goto LAB_00205ac8;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0)
            ;
          }
          else {
LAB_00205ac8:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
          }
          local_310 = (ulong *)*puVar7;
          puVar9 = puVar7 + 2;
          if (local_310 == puVar9) {
            local_300 = *puVar9;
            lStack_2f8 = puVar7[3];
            local_310 = &local_300;
          }
          else {
            local_300 = *puVar9;
          }
          local_308 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if (local_2d0 == paVar12) {
            local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_2c0._8_8_ = puVar7[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          }
          local_2c8 = puVar7[1];
          *puVar7 = paVar12;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if (paVar12 != paVar13) goto LAB_002061cb;
          local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_2b0.field_2._8_8_ = puVar7[3];
          goto LAB_002061d8;
        }
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","")
      ;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_250._M_dataplus._M_p = (pointer)*plVar6;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)local_250._M_dataplus._M_p == puVar9) {
        local_250.field_2._M_allocated_capacity = *puVar9;
        local_250.field_2._8_8_ = plVar6[3];
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar9;
      }
      local_250._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*plVar6;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)local_290._M_dataplus._M_p == puVar9) {
        local_290.field_2._M_allocated_capacity = *puVar9;
        local_290.field_2._8_8_ = plVar6[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar9;
      }
      local_290._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_1a0._M_dataplus._M_p._0_4_ = 0x429;
      StreamableToString<int>(&local_230,(int *)&local_1a0);
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar16 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_230._M_string_length + local_290._M_string_length) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar16 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_230._M_string_length + local_290._M_string_length)
        goto LAB_00204ba3;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
      }
      else {
LAB_00204ba3:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
      }
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if (local_2f0 == paVar12) {
        local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2e0._8_8_ = puVar7[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2e8 = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      paVar12->_M_local_buf[0] = '\0';
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_310 == puVar9) {
        local_300 = *puVar9;
        lStack_2f8 = puVar7[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar9;
      }
      local_308 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if (local_2d0 == paVar12) {
        local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2c0._8_8_ = puVar7[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2c8 = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*puVar7;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar13) {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar7[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2b0._M_string_length = puVar7[1];
      *puVar7 = paVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar7 = extraout_RAX;
      paVar12 = extraout_RDX;
      goto LAB_00205870;
    }
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_310 == puVar9) {
      local_300 = *puVar9;
      lStack_2f8 = puVar7[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar9;
    }
    local_308 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if (local_2d0 == paVar12) {
      local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_2c0._8_8_ = puVar7[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_2c8 = puVar7[1];
    *puVar7 = paVar12;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x46e;
    StreamableToString<int>(&local_290,(int *)&local_250);
    uVar16 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar16 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_290._M_string_length + local_2c8) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar16 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_290._M_string_length + local_2c8) goto LAB_0020563c;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_0020563c:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar12) {
      local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar7[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar7[1];
    *puVar7 = paVar12;
    puVar7[1] = 0;
    paVar12->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_c8.sa_handler = (__sighandler_t)*puVar7;
    p_Var10 = (__sighandler_t)(puVar7 + 2);
    if (local_c8.sa_handler == p_Var10) {
      local_b8 = *(ulong *)p_Var10;
      uStack_b0 = puVar7[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(ulong *)p_Var10;
    }
    local_c0 = (undefined1  [8])puVar7[1];
    *puVar7 = p_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    local_160.sa_handler = (__sighandler_t)*puVar7;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.sa_handler != paVar12) goto LAB_00205fe4;
    local_150[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_150[0]._8_8_ = puVar7[3];
    local_160.sa_handler = (__sighandler_t)local_150;
  }
  local_158 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)&local_160);
  puVar7 = extraout_RAX_03;
  local_2d0 = extraout_RDX_03;
  goto LAB_0020601b;
LAB_002048b3:
  do {
    iVar5 = close(local_20c);
    if (iVar5 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar3;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_210;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_208);
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,local_1b0 + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      return OVERSEE_TEST;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_2f0 == paVar12) {
    local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2e0._8_8_ = puVar7[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_2e8 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*plVar6;
  puVar9 = (ulong *)(plVar6 + 2);
  if (local_310 == puVar9) {
    local_300 = *puVar9;
    lStack_2f8 = plVar6[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar9;
  }
  local_308 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_270._M_dataplus._M_p._0_4_ = 0x485;
  StreamableToString<int>(&local_250,(int *)&local_270);
  uVar15 = 0xf;
  if (local_310 != &local_300) {
    uVar15 = local_300;
  }
  if (uVar15 < local_250._M_string_length + local_308) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar16 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_250._M_string_length + local_308) goto LAB_00204d1a;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_00204d1a:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_250._M_dataplus._M_p);
  }
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_2d0 == paVar12) {
    local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2c0._8_8_ = puVar7[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_2c8 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  paVar12->_M_local_buf[0] = '\0';
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar12) {
    local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar7[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_c8.sa_handler = (__sighandler_t)*plVar6;
  p_Var10 = (__sighandler_t)(plVar6 + 2);
  if (local_c8.sa_handler == p_Var10) {
    local_b8 = *(ulong *)p_Var10;
    uStack_b0 = plVar6[3];
    local_c8.sa_handler = (__sighandler_t)&local_b8;
  }
  else {
    local_b8 = *(ulong *)p_Var10;
  }
  local_c0 = (undefined1  [8])plVar6[1];
  *plVar6 = (long)p_Var10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
  local_160.sa_handler = (__sighandler_t)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.sa_handler != paVar13) goto LAB_0020589e;
  local_150[0]._0_8_ = paVar13->_M_allocated_capacity;
  local_150[0]._8_8_ = puVar7[3];
  local_160.sa_handler = (__sighandler_t)local_150;
  goto LAB_002058b1;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_0020481c:
    iVar5 = sigaction(0x1b,(sigaction *)&local_160,(sigaction *)0x0);
    if (iVar5 != -1) {
      if (iVar3 != -1) goto LAB_002048b3;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*puVar7;
      puVar9 = puVar7 + 2;
      if ((ulong *)local_290._M_dataplus._M_p == puVar9) {
        local_290.field_2._M_allocated_capacity = *puVar9;
        local_290.field_2._8_8_ = puVar7[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar9;
      }
      local_290._M_string_length = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if (local_2f0 == paVar12) {
        local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2e0._8_8_ = puVar7[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2e8 = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x456;
      StreamableToString<int>(&local_270,(int *)&local_230);
      uVar16 = 0xf;
      if (local_2f0 != &local_2e0) {
        uVar16 = local_2e0._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_270._M_string_length + local_2e8) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          uVar16 = local_270.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_270._M_string_length + local_2e8) goto LAB_0020582b;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
      }
      else {
LAB_0020582b:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
      }
      local_310 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_310 == puVar9) {
        local_300 = *puVar9;
        lStack_2f8 = puVar7[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar9;
      }
      local_308 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)puVar9 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if (local_2d0 == paVar12) {
        local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2c0._8_8_ = puVar7[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2c8 = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*plVar6;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar13) {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar6[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2b0._M_string_length = plVar6[1];
      *plVar6 = (long)paVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar7 = extraout_RAX_04;
      local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_0020616f;
    }
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_250._M_dataplus._M_p = (pointer)*puVar7;
  puVar9 = puVar7 + 2;
  if ((ulong *)local_250._M_dataplus._M_p == puVar9) {
    local_250.field_2._M_allocated_capacity = *puVar9;
    local_250.field_2._8_8_ = puVar7[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar9;
  }
  local_250._M_string_length = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_dataplus._M_p = (pointer)*puVar7;
  puVar9 = puVar7 + 2;
  if ((ulong *)local_290._M_dataplus._M_p == puVar9) {
    local_290.field_2._M_allocated_capacity = *puVar9;
    local_290.field_2._8_8_ = puVar7[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *puVar9;
  }
  local_290._M_string_length = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x453;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    uVar16 = local_290.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_230._M_string_length + local_290._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar16 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_230._M_string_length + local_290._M_string_length) goto LAB_00204c69;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
  }
  else {
LAB_00204c69:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_2f0 == paVar12) {
    local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2e0._8_8_ = puVar7[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_2e8 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  paVar12->_M_local_buf[0] = '\0';
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_310 == puVar9) {
    local_300 = *puVar9;
    lStack_2f8 = puVar7[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar9;
  }
  local_308 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_2d0 == paVar12) {
    local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2c0._8_8_ = puVar7[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_2c8 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (paVar12 == paVar13) {
    local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar7[3];
  }
  else {
LAB_00205870:
    local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_2b0._M_string_length = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar7 = extraout_RAX_00;
  local_160 = extraout_RDX_00;
LAB_0020589e:
  local_150[0]._0_8_ = paVar13->_M_allocated_capacity;
LAB_002058b1:
  local_158 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)&local_160);
  puVar7 = extraout_RAX_01;
  paVar12 = extraout_RDX_01;
LAB_002058d5:
  local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
  local_2f0 = paVar12;
LAB_002058e2:
  local_2e8 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x435;
  StreamableToString<int>(&local_270,(int *)&local_230);
  uVar16 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar16 = local_2e0._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_270._M_string_length + local_2e8) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar16 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_270._M_string_length + local_2e8) goto LAB_0020596c;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_0020596c:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
  }
  local_310 = (ulong *)*puVar7;
  puVar9 = puVar7 + 2;
  if (local_310 == puVar9) {
    local_300 = *puVar9;
    lStack_2f8 = puVar7[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar9;
  }
  local_308 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_2d0 == paVar12) {
    local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2c0._8_8_ = puVar7[3];
    local_2d0 = &local_2c0;
  }
  else {
LAB_0020601b:
    local_2c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_2c8 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar13) {
    local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar7[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_0020616f:
    local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar7 = extraout_RAX_05;
  paVar12 = extraout_RDX_05;
LAB_0020619d:
  local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar12;
LAB_002061aa:
  local_2b0._M_string_length = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar7 = extraout_RAX_06;
  paVar12 = extraout_RDX_06;
LAB_002061cb:
  local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar12;
LAB_002061d8:
  local_2b0._M_string_length = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)&local_208);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}